

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

float __thiscall
duckdb::Interpolator<false>::Extract<float,float>
          (Interpolator<false> *this,float *dest,Vector *result)

{
  idx_t iVar1;
  idx_t iVar2;
  float fVar3;
  float fVar4;
  
  iVar1 = this->CRN;
  iVar2 = this->FRN;
  fVar3 = Cast::Operation<float,float>(*dest);
  if (iVar1 != iVar2) {
    fVar4 = Cast::Operation<float,float>(dest[1]);
    fVar3 = (float)((double)(fVar4 - fVar3) *
                    (this->RN -
                    (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25
                     ) + ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                   (double)fVar3);
  }
  return fVar3;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}